

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketHandshake.h
# Opt level: O2

void uWS::WebSocketHandshake::Sha1Loop<4>::f<7>(uint32_t *a,uint32_t *b)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = b[7] ^ b[0xc] ^ b[1] ^ b[0xf];
  uVar2 = uVar1 << 1 | (uint)((int)uVar1 < 0);
  b[0xf] = uVar2;
  uVar1 = *a;
  a[2] = a[2] + (a[1] << 5 | a[1] >> 0x1b) + uVar2 + (a[4] & uVar1 | (a[4] | uVar1) & a[3]) +
         0x8f1bbcdc;
  *a = uVar1 << 0x1e | uVar1 >> 2;
  return;
}

Assistant:

static inline uint32_t rol(uint32_t value, size_t bits) {return (value << bits) | (value >> (32 - bits));}